

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview_p.h
# Opt level: O1

void __thiscall QTableViewPrivate::~QTableViewPrivate(QTableViewPrivate *this)

{
  Data *pDVar1;
  long lVar2;
  
  *(undefined ***)
   &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate = &PTR__QTableViewPrivate_0081d0d8;
  QSpanCollection::~QSpanCollection(&this->spans);
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::~vector
            (&this->dynHorHeaderConnections);
  lVar2 = 0x620;
  do {
    QMetaObject::Connection::~Connection
              ((Connection *)
               (&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 super_QFramePrivate.super_QWidgetPrivate.super_QObjectPrivate + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != 0x5f8);
  lVar2 = 0x5f8;
  do {
    QMetaObject::Connection::~Connection
              ((Connection *)
               (&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 super_QFramePrivate.super_QWidgetPrivate.super_QObjectPrivate + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != 0x5c0);
  lVar2 = 0x5c0;
  do {
    QMetaObject::Connection::~Connection
              ((Connection *)
               (&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 super_QFramePrivate.super_QWidgetPrivate.super_QObjectPrivate + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != 0x5a0);
  QMetaObject::Connection::~Connection(&this->selectionmodelConnection);
  QMetaObject::Connection::~Connection(&this->cornerWidgetConnection);
  pDVar1 = (this->rowsToUpdate).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->rowsToUpdate).d.d)->super_QArrayData,4,0x10);
    }
  }
  pDVar1 = (this->columnsToUpdate).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->columnsToUpdate).d.d)->super_QArrayData,4,0x10);
    }
  }
  if ((this->rowResizeTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  if ((this->columnResizeTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  QAbstractItemViewPrivate::~QAbstractItemViewPrivate(&this->super_QAbstractItemViewPrivate);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QTableViewPrivate : public QAbstractItemViewPrivate
{
    Q_DECLARE_PUBLIC(QTableView)
public:
    QTableViewPrivate()
        : showGrid(true), gridStyle(Qt::SolidLine),
          horizontalHeader(nullptr), verticalHeader(nullptr),
          sortingEnabled(false), geometryRecursionBlock(false),
          visualCursor(QPoint())
 {
    wrapItemText = true;
#if QT_CONFIG(draganddrop)
    overwrite = true;
#endif
 }